

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

intMatrix * __thiscall Image::getBinaryMatrix(intMatrix *__return_storage_ptr__,Image *this)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  int in_R8D;
  long lVar6;
  undefined4 uVar7;
  size_type __n;
  Mat tmp_gray_img;
  allocator_type local_a1;
  vector<int,_std::allocator<int>_> local_a0;
  Mat local_88 [8];
  int local_80;
  int local_7c;
  long local_78;
  long *local_40;
  _InputArray local_28;
  
  cv::Mat::Mat(local_88,&this->content);
  local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0x1010000;
  local_28.sz.width = 0;
  local_28.sz.height = 0;
  local_28.flags = 0x2010000;
  local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_88;
  local_28.obj = local_88;
  cv::cvtColor((cv *)&local_a0,&local_28,(_OutputArray *)0x6,0,in_R8D);
  __n = (size_type)local_80;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_a0,(long)local_7c,(allocator_type *)&local_28);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,__n,&local_a0,&local_a1);
  pvVar4 = (void *)CONCAT44(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
  }
  if (0 < local_80) {
    pvVar1 = (__return_storage_ptr__->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      if (0 < local_7c) {
        lVar2 = *local_40;
        lVar3 = *(long *)&pvVar1[lVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        lVar6 = 0;
        do {
          uVar7 = 0;
          if (0x96 < *(byte *)(lVar2 * lVar5 + local_78 + lVar6)) {
            uVar7 = 0xff;
          }
          *(undefined4 *)(lVar3 + lVar6 * 4) = uVar7;
          lVar6 = lVar6 + 1;
        } while (lVar6 < local_7c);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < local_80);
  }
  cv::Mat::~Mat(local_88);
  return __return_storage_ptr__;
}

Assistant:

intMatrix Image::getBinaryMatrix(){
    cv::Mat tmp_gray_img = content;
    cv::cvtColor(tmp_gray_img, tmp_gray_img, cv::COLOR_BGR2GRAY);
    intMatrix binary_matrix(tmp_gray_img.rows, std::vector<int>(tmp_gray_img.cols));
    for(int i = 0; i<tmp_gray_img.rows;++i){
        for(int j=0; j<tmp_gray_img.cols;++j){
            binary_matrix[i][j] = (tmp_gray_img.at<uchar>(i, j) > THRESHOLD) ? ON : OFF;
        }
    }
    return binary_matrix;
}